

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printLogicalImm64(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  byte bVar3;
  uint uVar4;
  MCOperand *op;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar5 = MCOperand_getImm(op);
  uVar9 = (uint)(uVar5 >> 6);
  uVar4 = (uint)uVar5 & 0x3f;
  uVar6 = (uVar9 & 0x40 | uVar4) ^ 0x3f;
  iVar7 = -1;
  do {
    iVar8 = iVar7 + 1;
    if (iVar7 == 0x1d) break;
    uVar6 = uVar6 * 2;
    iVar7 = iVar8;
  } while (-1 < (int)uVar6);
  uVar6 = 0x40000000 >> ((byte)iVar8 & 0x1f);
  bVar3 = (byte)(uVar6 - 1);
  uVar5 = ~(-1L << (((byte)uVar4 & bVar3) + 1 & 0x3f));
  for (uVar9 = uVar9 & 0x3ffffff & uVar6 - 1 & 0x3f; uVar9 != 0; uVar9 = uVar9 - 1) {
    uVar5 = uVar5 >> 1 | (ulong)((uint)uVar5 & 1) << (bVar3 & 0x3f);
  }
  if (iVar8 != 0x18) {
    do {
      uVar5 = uVar5 | uVar5 << ((byte)uVar6 & 0x3f);
      uVar6 = uVar6 * 2;
    } while (uVar6 != 0x40);
  }
  uVar9 = MI->flat_insn->id;
  if ((int)uVar9 < 200) {
    if ((uVar9 == 0xe) || (uVar9 == 0x3f)) {
LAB_00180432:
      if (uVar5 < 10) {
        SStream_concat(O,"#%u",uVar5 & 0xffffffff);
      }
      else {
        SStream_concat(O,"#0x%lx",uVar5);
      }
      goto LAB_0018046f;
    }
  }
  else if ((uVar9 == 200) || (uVar9 == 0x1b3)) goto LAB_00180432;
  printInt64Bang(O,uVar5);
LAB_0018046f:
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
         (long)(int)uVar5;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printLogicalImm64(MCInst *MI, unsigned OpNum, SStream *O)
{
	int64_t Val = MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	Val = AArch64_AM_decodeLogicalImmediate(Val, 64);

	switch(MI->flat_insn->id) {
		default:
			printInt64Bang(O, Val);
			break;
		case ARM64_INS_ORR:
		case ARM64_INS_AND:
		case ARM64_INS_EOR:
		case ARM64_INS_TST:
			// do not print number in negative form
			if (Val >= 0 && Val <= HEX_THRESHOLD)
				SStream_concat(O, "#%u", (int)Val);
			else
				SStream_concat(O, "#0x%"PRIx64, Val);
			break;
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)Val;
		MI->flat_insn->detail->arm64.op_count++;
	}
}